

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
 mp::internal::ExprTypes::
 UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
           (Expr e)

{
  AssertionFailure *this;
  
  if (*(int *)e.super_ExprBase.impl_ - 0x32U < 3) {
    return (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
            )(Impl *)e.super_ExprBase.impl_;
  }
  this = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this,"invalid cast");
  __cxa_throw(this,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

expr::Kind kind() const { return kind_; }